

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O2

void __thiscall
Equality_unitsEqualPrecision3_Test::TestBody(Equality_unitsEqualPrecision3_Test *this)

{
  element_type *peVar1;
  char cVar2;
  allocator<char> local_80 [8];
  allocator<char> local_78 [8];
  AssertionResult local_70 [2];
  AssertionResult gtest_ar_;
  UnitsPtr u2;
  UnitsPtr u1;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"unitsA",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&u1);
  std::__cxx11::string::~string((string *)local_70);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_70,"unitsA",(allocator<char> *)&gtest_ar_);
  libcellml::Units::create((string *)&u2);
  std::__cxx11::string::~string((string *)local_70);
  peVar1 = u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"second",local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",local_80);
  libcellml::Units::addUnit((string *)peVar1,2.0000000000000004,(string *)local_70);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_70);
  peVar1 = u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::string<std::allocator<char>>((string *)local_70,"second",local_78);
  std::__cxx11::string::string<std::allocator<char>>((string *)&gtest_ar_,"",local_80);
  libcellml::Units::addUnit((string *)peVar1,2.0,(string *)local_70);
  std::__cxx11::string::~string((string *)&gtest_ar_);
  std::__cxx11::string::~string((string *)local_70);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Units,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_70,
             &u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  gtest_ar_.success_ =
       (bool)libcellml::Entity::equals
                       ((shared_ptr *)
                        u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70[0].message_);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_70,&gtest_ar_.success_,"u1->equals(u2)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x178,(char *)local_70[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    std::__cxx11::string::~string((string *)local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<libcellml::Units,void>
            ((__shared_ptr<libcellml::Entity,(__gnu_cxx::_Lock_policy)2> *)local_70,
             &u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>);
  cVar2 = libcellml::Entity::equals
                    ((shared_ptr *)
                     u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  gtest_ar_.success_ = (bool)cVar2;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_70[0].message_);
  if (cVar2 == '\0') {
    testing::Message::Message((Message *)local_78);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_70,&gtest_ar_.success_,"u2->equals(u1)","false");
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_80,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x179,(char *)local_70[0]._0_8_);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_80,(Message *)local_78);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_80);
    std::__cxx11::string::~string((string *)local_70);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)local_78);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u2.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&u1.super___shared_ptr<libcellml::Units,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, unitsEqualPrecision3)
{
    libcellml::UnitsPtr u1 = libcellml::Units::create("unitsA");
    libcellml::UnitsPtr u2 = libcellml::Units::create("unitsA");

    u1->addUnit("second", 2.000000000000000444089209850062616169452667236328125);
    u2->addUnit("second", 2.0);

    EXPECT_TRUE(u1->equals(u2));
    EXPECT_TRUE(u2->equals(u1));
}